

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O2

int lib::base::Require(State *state)

{
  bool bVar1;
  String *this;
  string module;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&api,1,ValueT_String);
  if (bVar1) {
    this = luna::StackAPI::GetString(&api,0);
    luna::String::GetStdString_abi_cxx11_(&module,this);
    bVar1 = luna::State::IsModuleLoaded(state,&module);
    if (!bVar1) {
      luna::State::DoModule(state,&module);
    }
    std::__cxx11::string::~string((string *)&module);
  }
  return 0;
}

Assistant:

int Require(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_String))
            return 0;

        auto module = api.GetString(0)->GetStdString();
        if (!state->IsModuleLoaded(module))
            state->DoModule(module);

        return 0;
    }